

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int gpioNotifyOpenWithSize(int bufSize)

{
  FILE *__stream;
  int __fd;
  int iVar1;
  uint32_t uVar2;
  uint16_t *puVar3;
  int slot;
  ulong uVar4;
  ulong uVar5;
  char name [32];
  char acStack_58 [40];
  
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    gpioNotifyOpenWithSize_cold_1();
  }
  if (libInitialised == '\0') {
    slot = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      gpioNotifyOpenWithSize_cold_2();
    }
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)notifyMutex_mutex);
    puVar3 = &gpioNotify[0].state;
    uVar5 = 0;
    do {
      if (*puVar3 == 0) {
        *puVar3 = 1;
        uVar4 = uVar5 & 0xffffffff;
        goto LAB_0011e9ec;
      }
      uVar5 = uVar5 + 1;
      puVar3 = puVar3 + 0xe;
    } while (uVar5 != 0x20);
    uVar4 = 0xffffffff;
    uVar5 = 0x20;
LAB_0011e9ec:
    iVar1 = (int)uVar5;
    pthread_mutex_unlock((pthread_mutex_t *)notifyMutex_mutex);
    slot = (int)uVar4;
    if (slot < 0) {
      slot = -0x18;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        gpioNotifyOpenWithSize_cold_4();
      }
    }
    else {
      sprintf(acStack_58,"/dev/pigpio%d",uVar4);
      myCreatePipe(acStack_58,0x1b4);
      __fd = open(acStack_58,0x802);
      if (__fd < 0) {
        gpioNotify[uVar4].state = 0;
        slot = -0x17;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          gpioNotifyOpenWithSize_cold_3();
        }
      }
      else {
        if ((bufSize != 0) && (iVar1 = fcntl(__fd,0x407,bufSize), iVar1 != bufSize)) {
          gpioNotify[uVar4].state = 0;
          __stream = _stderr;
          if ((gpioCfg.internals >> 10 & 1) != 0) {
            return -0x17;
          }
          myTimeStamp();
          fprintf(__stream,"%s %s: fcntl %s size %d failed (%m)\n",myTimeStamp::buf,
                  "gpioNotifyOpenWithSize",acStack_58,bufSize);
          return -0x17;
        }
        gpioNotify[uVar4].seqno = 0;
        gpioNotify[uVar4].bits = 0;
        gpioNotify[uVar4].fd = __fd;
        gpioNotify[uVar4].pipe = 1;
        gpioNotify[uVar4].max_emits = 0x155;
        uVar2 = gpioTick();
        gpioNotify[uVar4].lastReportTick = uVar2;
        gpioNotify[iVar1].state = 3;
        closeOrphanedNotifications(slot,__fd);
      }
    }
  }
  return slot;
}

Assistant:

int gpioNotifyOpenWithSize(int bufSize)
{
   int i, slot, fd;
   char name[32];

   DBG(DBG_USER, "bufSize=%d", bufSize);

   CHECK_INITED;

   slot = -1;

   notifyMutex(1);

   for (i=0; i<PI_NOTIFY_SLOTS; i++)
   {
      if (gpioNotify[i].state == PI_NOTIFY_CLOSED)
      {
         slot = i;
         gpioNotify[slot].state = PI_NOTIFY_RESERVED;
         break;
      }
   }

   notifyMutex(0);

   if (slot < 0) SOFT_ERROR(PI_NO_HANDLE, "no handle");

   sprintf(name, "/dev/pigpio%d", slot);

   myCreatePipe(name, 0664);

   fd = open(name, O_RDWR|O_NONBLOCK);

   if (fd < 0)
   {
      gpioNotify[slot].state = PI_NOTIFY_CLOSED;
      SOFT_ERROR(PI_BAD_PATHNAME, "open %s failed (%m)", name);
   }

   if (bufSize != 0)
   {
      i = fcntl(fd, F_SETPIPE_SZ, bufSize);
      if (i != bufSize)
      {
         gpioNotify[slot].state = PI_NOTIFY_CLOSED;
         SOFT_ERROR(PI_BAD_PATHNAME,
            "fcntl %s size %d failed (%m)", name, bufSize);
      }
   }

   gpioNotify[slot].seqno = 0;
   gpioNotify[slot].bits  = 0;
   gpioNotify[slot].fd    = fd;
   gpioNotify[slot].pipe  = 1;
   gpioNotify[slot].max_emits  = MAX_EMITS;
   gpioNotify[slot].lastReportTick = gpioTick();
   gpioNotify[i].state = PI_NOTIFY_OPENED;

   closeOrphanedNotifications(slot, fd);

   return slot;
}